

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O3

void __thiscall CommandBlock::~CommandBlock(CommandBlock *this)

{
  Process *this_00;
  pointer pcVar1;
  
  (this->super_Block)._vptr_Block = (_func_int **)&PTR__CommandBlock_0018dc78;
  this_00 = this->process;
  if (this_00 != (Process *)0x0) {
    TinyProcessLib::Process::~Process(this_00);
  }
  operator_delete(this_00);
  pcVar1 = (this->consoleOutput)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->consoleOutput).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->command)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->command).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~CommandBlock()
    {
        delete process;
    }